

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForData(pollfd *fds,nfds_t count,double *timeout)

{
  int iVar1;
  int iVar2;
  uint64_t uVar3;
  int *piVar4;
  uint64_t uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int result_1;
  int error;
  int result;
  timespec ts;
  long nanoseconds;
  time_t seconds;
  uint64_t base;
  double *timeout_local;
  nfds_t count_local;
  pollfd *fds_local;
  
  do {
    while (timeout != (double *)0x0) {
      uVar3 = _glfwPlatformGetTimerValue();
      _error = (long)*timeout;
      ts.tv_sec = (__time_t)((*timeout - (double)_error) * 1000000000.0);
      ts.tv_nsec = ts.tv_sec;
      iVar1 = ppoll((pollfd *)fds,count,(timespec *)&error,(__sigset_t *)0x0);
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      uVar5 = _glfwPlatformGetTimerValue();
      lVar6 = uVar5 - uVar3;
      auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = 0x45300000;
      uVar3 = _glfwPlatformGetTimerFrequency();
      auVar8._8_4_ = (int)(uVar3 >> 0x20);
      auVar8._0_8_ = uVar3;
      auVar8._12_4_ = 0x45300000;
      *timeout = *timeout -
                 ((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
      if (0 < iVar1) {
        return 1;
      }
      if (((iVar1 == -1) && (iVar2 != 4)) && (iVar2 != 0xb)) {
        return 0;
      }
      if (*timeout <= 0.0) {
        return 0;
      }
    }
    iVar2 = poll((pollfd *)fds,count,-1);
    if (0 < iVar2) {
      return 1;
    }
  } while (((iVar2 != -1) || (piVar4 = __errno_location(), *piVar4 == 4)) ||
          (piVar4 = __errno_location(), *piVar4 == 0xb));
  return 0;
}

Assistant:

static GLFWbool waitForData(struct pollfd* fds, nfds_t count, double* timeout)
{
    for (;;)
    {
        if (timeout)
        {
            const uint64_t base = _glfwPlatformGetTimerValue();

#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) || defined(__CYGWIN__)
            const time_t seconds = (time_t) *timeout;
            const long nanoseconds = (long) ((*timeout - seconds) * 1e9);
            const struct timespec ts = { seconds, nanoseconds };
            const int result = ppoll(fds, count, &ts, NULL);
#elif defined(__NetBSD__)
            const time_t seconds = (time_t) *timeout;
            const long nanoseconds = (long) ((*timeout - seconds) * 1e9);
            const struct timespec ts = { seconds, nanoseconds };
            const int result = pollts(fds, count, &ts, NULL);
#else
            const int milliseconds = (int) (*timeout * 1e3);
            const int result = poll(fds, count, milliseconds);
#endif
            const int error = errno; // clock_gettime may overwrite our error

            *timeout -= (_glfwPlatformGetTimerValue() - base) /
                (double) _glfwPlatformGetTimerFrequency();

            if (result > 0)
                return GLFW_TRUE;
            else if (result == -1 && error != EINTR && error != EAGAIN)
                return GLFW_FALSE;
            else if (*timeout <= 0.0)
                return GLFW_FALSE;
        }
        else
        {
            const int result = poll(fds, count, -1);
            if (result > 0)
                return GLFW_TRUE;
            else if (result == -1 && errno != EINTR && errno != EAGAIN)
                return GLFW_FALSE;
        }
    }
}